

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmStateSnapshot * __thiscall
cmState::CreateBaseSnapshot(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *this_00;
  cmLinkedTree<cmDefinitions> *this_01;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  iterator it;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  PositionType pos;
  SnapshotDataType local_100;
  
  this_00 = &this->SnapshotData;
  memset(&local_100,0,0xd0);
  it.Position = 0;
  it.Tree = this_00;
  local_100.ScopeParent =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(this_00,it,&local_100);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  (pSVar3->DirectoryParent).Tree = this_00;
  (pSVar3->DirectoryParent).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  (pSVar3->ScopeParent).Tree = this_00;
  (pSVar3->ScopeParent).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->SnapshotType = BaseType;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->Keep = true;
  iVar5.Position = 0;
  iVar5.Tree = &this->BuildsystemDirectory;
  iVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,iVar5);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->BuildSystemDirectory = iVar5;
  iVar6.Position = 0;
  iVar6.Tree = &this->ExecutionListFiles;
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar6);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->ExecutionListFile = iVar6;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->IncludeDirectoryPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->CompileDefinitionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->CompileOptionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->LinkOptionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar3->LinkDirectoriesPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->CurrentScope).Tree = local_100.ScopeParent.Tree;
  (pBVar4->CurrentScope).Position = local_100.ScopeParent.Position;
  pcVar1 = &this->PolicyStack;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  (pSVar3->Policies).Tree = pcVar1;
  (pSVar3->Policies).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  (pSVar3->PolicyRoot).Tree = pcVar1;
  (pSVar3->PolicyRoot).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  (pSVar3->PolicyScope).Tree = pcVar1;
  (pSVar3->PolicyScope).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pcVar1 = (pSVar3->Policies).Tree;
  if ((pcVar1 == (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) ||
     ((ulong)((long)(pcVar1->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pcVar1->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) < (pSVar3->Policies).Position))
  {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x33c,"cmStateSnapshot cmState::CreateBaseSnapshot()");
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pcVar1 = (pSVar3->PolicyRoot).Tree;
  if ((pcVar1 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
     ((pSVar3->PolicyRoot).Position <=
      (ulong)((long)(pcVar1->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pcVar1->Data).
                    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6))) {
    this_01 = &this->VarTree;
    iVar7.Position = 0;
    iVar7.Tree = this_01;
    iVar7 = cmLinkedTree<cmDefinitions>::Push(this_01,iVar7);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       (&local_100.ScopeParent);
    pSVar3->Vars = iVar7;
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       (&local_100.ScopeParent);
    pcVar2 = (pSVar3->Vars).Tree;
    if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
       ((pSVar3->Vars).Position <=
        (ulong)(((long)(pcVar2->Data).
                       super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pcVar2->Data).
                       super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&local_100.ScopeParent);
      (pSVar3->Parent).Tree = this_01;
      (pSVar3->Parent).Position = 0;
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&local_100.ScopeParent);
      (pSVar3->Root).Tree = this_01;
      (pSVar3->Root).Position = 0;
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_100.ScopeParent);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x33f,"cmStateSnapshot cmState::CreateBaseSnapshot()");
  }
  __assert_fail("pos->PolicyRoot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x33d,"cmStateSnapshot cmState::CreateBaseSnapshot()");
}

Assistant:

cmStateSnapshot cmState::CreateBaseSnapshot()
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(this->SnapshotData.Root());
  pos->DirectoryParent = this->SnapshotData.Root();
  pos->ScopeParent = this->SnapshotData.Root();
  pos->SnapshotType = cmStateEnums::BaseType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
    this->BuildsystemDirectory.Push(this->BuildsystemDirectory.Root());
  pos->ExecutionListFile =
    this->ExecutionListFiles.Push(this->ExecutionListFiles.Root());
  pos->IncludeDirectoryPosition = 0;
  pos->CompileDefinitionsPosition = 0;
  pos->CompileOptionsPosition = 0;
  pos->LinkOptionsPosition = 0;
  pos->LinkDirectoriesPosition = 0;
  pos->BuildSystemDirectory->CurrentScope = pos;
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());
  pos->Vars = this->VarTree.Push(this->VarTree.Root());
  assert(pos->Vars.IsValid());
  pos->Parent = this->VarTree.Root();
  pos->Root = this->VarTree.Root();
  return { this, pos };
}